

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harris.cpp
# Opt level: O0

Derivatives * __thiscall
Harris::ApplyGaussToDerivatives
          (Derivatives *__return_storage_ptr__,Harris *this,Derivatives *dMats,int filterRange)

{
  Harris local_158;
  Harris local_f8;
  Harris local_88;
  undefined1 local_25;
  int local_24;
  Derivatives *pDStack_20;
  int filterRange_local;
  Derivatives *dMats_local;
  Harris *this_local;
  Derivatives *mdMats;
  
  local_24 = filterRange;
  pDStack_20 = dMats;
  dMats_local = (Derivatives *)this;
  this_local = (Harris *)__return_storage_ptr__;
  if (filterRange == 0) {
    Derivatives::Derivatives(__return_storage_ptr__,dMats);
  }
  else {
    local_25 = 0;
    Derivatives::Derivatives(__return_storage_ptr__);
    GaussFilter(&local_88,&this->harrisResponses,(int)pDStack_20);
    cv::Mat::operator=(&__return_storage_ptr__->Ix,&local_88.harrisResponses);
    cv::Mat::~Mat(&local_88.harrisResponses);
    GaussFilter(&local_f8,&this->harrisResponses,(int)pDStack_20 + 0x60);
    cv::Mat::operator=(&__return_storage_ptr__->Iy,&local_f8.harrisResponses);
    cv::Mat::~Mat(&local_f8.harrisResponses);
    GaussFilter(&local_158,&this->harrisResponses,(int)pDStack_20 + 0xc0);
    cv::Mat::operator=(&__return_storage_ptr__->Ixy,&local_158.harrisResponses);
    cv::Mat::~Mat(&local_158.harrisResponses);
  }
  return __return_storage_ptr__;
}

Assistant:

Derivatives Harris::ApplyGaussToDerivatives(Derivatives& dMats, int filterRange) {
    if(filterRange == 0)
        return dMats;

    Derivatives mdMats;

    mdMats.Ix = GaussFilter(dMats.Ix, filterRange);
    mdMats.Iy = GaussFilter(dMats.Iy, filterRange);
    mdMats.Ixy = GaussFilter(dMats.Ixy, filterRange);

    return mdMats;
}